

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

size_t dgrminer::support<std::set<int,std::less<int>,std::allocator<int>>>
                 (set<int,_std::less<int>,_std::allocator<int>_> *occurrences,
                 unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *multiple_occurrences,bool new_measures,bool heuristic_mis)

{
  _Rb_tree_node_base *__k;
  int iVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  undefined7 in_register_00000011;
  _Rb_tree_header *p_Var7;
  map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  mapping;
  set<int,_std::less<int>,_std::allocator<int>_> intersect;
  OverlapGraph og;
  size_t local_128;
  _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  local_f8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  OverlapGraph local_98;
  
  if ((int)CONCAT71(in_register_00000011,new_measures) == 0) {
    local_128 = (occurrences->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    p_Var6 = (occurrences->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(occurrences->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 == p_Var7) {
      local_128 = 0;
    }
    else {
      local_128 = 0;
      do {
        __k = p_Var6 + 1;
        OverlapGraph::OverlapGraph(&local_98,heuristic_mis);
        local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_f8._M_impl.super__Rb_tree_header._M_header;
        local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
        pmVar2 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)multiple_occurrences,(key_type *)__k);
        for (p_Var4 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          iVar1 = OverlapGraph::addVertex(&local_98);
          pmVar3 = std::
                   map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                   ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                                 *)&local_f8,(key_type *)(p_Var4 + 1));
          *pmVar3 = iVar1;
        }
        pmVar2 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)multiple_occurrences,(key_type *)__k);
        for (p_Var5 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar2 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)multiple_occurrences,(key_type *)__k),
            (_Rb_tree_header *)p_Var5 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          for (; pmVar2 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)multiple_occurrences,(key_type *)__k),
              (_Rb_tree_header *)p_Var4 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_c8._M_impl.super__Rb_tree_header._M_header;
            local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
            std::
            __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (p_Var5[1]._M_right,&p_Var5[1]._M_parent,p_Var4[1]._M_right,
                       &p_Var4[1]._M_parent,&local_c8);
            if (local_c8._M_impl.super__Rb_tree_header._M_node_count != 0) {
              pmVar3 = std::
                       map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                       ::at((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                             *)&local_f8,(key_type *)(p_Var5 + 1));
              iVar1 = *pmVar3;
              pmVar3 = std::
                       map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                       ::at((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                             *)&local_f8,(key_type *)(p_Var4 + 1));
              OverlapGraph::addEdge(&local_98,iVar1,*pmVar3);
            }
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_c8);
          }
        }
        iVar1 = OverlapGraph::computeSupport(&local_98);
        local_128 = local_128 + (long)iVar1;
        std::
        _Rb_tree<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
        ::~_Rb_tree(&local_f8);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ::~_Rb_tree(&local_98.adjacencyLists._M_t);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_98.vertices._M_t);
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var7);
    }
  }
  return local_128;
}

Assistant:

inline size_t support(const T &occurrences,
					  const std::unordered_map<int, std::set<std::set<int>>> &multiple_occurrences,
					  bool new_measures,
					  bool heuristic_mis
	) {
	  	if (new_measures) {
		  	size_t support = 0;

			for (auto const &snapshotId : occurrences) {
		  		OverlapGraph og(heuristic_mis);
		  		std::map<std::set<int>, int> mapping;

		  		for (auto const &occurrence : multiple_occurrences.at(snapshotId)) {
					mapping[occurrence] = og.addVertex();
		  		}

			  	for (
			  		auto firstOccurrence = multiple_occurrences.at(snapshotId).begin();
			  		firstOccurrence != multiple_occurrences.at(snapshotId).end();
			  		++firstOccurrence
				) {
					for (
						auto secondOccurrence = std::next(firstOccurrence);
						secondOccurrence != multiple_occurrences.at(snapshotId).end();
						++secondOccurrence
					) {
						std::set<int> intersect;
						std::set_intersection(
							firstOccurrence->begin(), firstOccurrence->end(),
							secondOccurrence->begin(), secondOccurrence->end(),
							std::inserter(intersect,intersect.begin())
						);

						if (!intersect.empty()) {
						  	og.addEdge(mapping.at(*firstOccurrence), mapping.at(*secondOccurrence));
						}
					}
				}

			  	support += og.computeSupport();
			}

		  	return support;
		}

	  	return occurrences.size();
	}